

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.c
# Opt level: O0

int32_t run_container_read(int32_t cardinality,run_container_t *container,char *buf)

{
  int32_t iVar1;
  ushort *in_RDX;
  uint *in_RSI;
  int32_t in_EDI;
  run_container_t *unaff_retaddr;
  uint16_t cast_16;
  _Bool in_stack_fffffffffffffffb;
  
  *in_RSI = (uint)*in_RDX;
  if ((int)in_RSI[1] < (int)*in_RSI) {
    run_container_grow(unaff_retaddr,in_EDI,in_stack_fffffffffffffffb);
  }
  if (0 < (int)*in_RSI) {
    memcpy(*(void **)(in_RSI + 2),in_RDX + 1,(long)(int)*in_RSI << 2);
  }
  iVar1 = run_container_size_in_bytes((run_container_t *)0x16d246);
  return iVar1;
}

Assistant:

int32_t run_container_read(int32_t cardinality, run_container_t *container,
                           const char *buf) {
    (void)cardinality;
    uint16_t cast_16;
    memcpy(&cast_16, buf, sizeof(uint16_t));
    container->n_runs = cast_16;
    if (container->n_runs > container->capacity)
        run_container_grow(container, container->n_runs, false);
    if (container->n_runs > 0) {
        memcpy(container->runs, buf + sizeof(uint16_t),
               container->n_runs * sizeof(rle16_t));
    }
    return run_container_size_in_bytes(container);
}